

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool loadKeyPresses<short>
               (string *fname,TWaveformViewT<short> *waveform,
               TKeyPressCollectionT<short> *keyPresses)

{
  int64_t iVar1;
  reference pvVar2;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *in_RDX;
  undefined8 *in_RSI;
  string *in_RDI;
  int i;
  int n;
  ifstream fin;
  int local_238;
  undefined4 in_stack_fffffffffffffdd8;
  int iVar3;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *in_stack_fffffffffffffde0;
  
  std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::clear
            ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)0x1a302c);
  std::ifstream::ifstream(&stack0xfffffffffffffde0,in_RDI,_S_bin);
  iVar3 = 0;
  std::istream::read(&stack0xfffffffffffffde0,(long)&stack0xfffffffffffffddc);
  std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::resize
            (in_stack_fffffffffffffde0,CONCAT44(iVar3,in_stack_fffffffffffffdd8));
  for (local_238 = 0; local_238 < iVar3; local_238 = local_238 + 1) {
    pvVar2 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator[]
                       (in_RDX,(long)local_238);
    iVar1 = in_RSI[1];
    (pvVar2->waveform).samples = (short *)*in_RSI;
    (pvVar2->waveform).n = iVar1;
    pvVar2 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator[]
                       (in_RDX,(long)local_238);
    std::istream::read(&stack0xfffffffffffffde0,(long)&pvVar2->pos);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&stack0xfffffffffffffde0);
  return true;
}

Assistant:

bool loadKeyPresses(const std::string & fname, const TWaveformViewT<T> & waveform, TKeyPressCollectionT<T> & keyPresses) {
    keyPresses.clear();

    std::ifstream fin(fname, std::ios::binary);
    int n = 0;
    fin.read((char *)(&n), sizeof(n));
    keyPresses.resize(n);
    for (int i = 0; i < n; ++i) {
        keyPresses[i].waveform = waveform;
        fin.read((char *)(&keyPresses[i].pos), sizeof(keyPresses[i].pos));
    }
    fin.close();

    return true;
}